

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt.cpp
# Opt level: O1

void get_msurf_descriptor_rounding(integral_image *iimage,interest_point *ipoint)

{
  int iVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int iVar18;
  ulong uVar19;
  float *pfVar20;
  int iVar21;
  long lVar22;
  int iVar23;
  float *data;
  ulong uVar24;
  long lVar25;
  long lVar26;
  float *pfVar27;
  ulong uVar28;
  float *pfVar29;
  int iVar30;
  uint uVar31;
  uint uVar32;
  ulong uVar33;
  float *pfVar34;
  int iVar35;
  float *pfVar36;
  int iVar37;
  float *pfVar38;
  int iVar39;
  float *pfVar40;
  int k_count;
  long lVar41;
  float *pfVar42;
  int iVar43;
  float *pfVar44;
  int k_count_1;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [64];
  float fVar58;
  float fVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar68;
  undefined1 in_ZMM8 [64];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [64];
  int data_width;
  
  auVar52._8_4_ = 0x80000000;
  auVar52._0_8_ = 0x8000000080000000;
  auVar52._12_4_ = 0x80000000;
  auVar53._8_4_ = 0x3effffff;
  auVar53._0_8_ = 0x3effffff3effffff;
  auVar53._12_4_ = 0x3effffff;
  fVar59 = ipoint->scale;
  auVar71 = ZEXT464((uint)fVar59);
  auVar45 = vpternlogd_avx512vl(auVar53,ZEXT416((uint)fVar59),auVar52,0xf8);
  auVar45 = ZEXT416((uint)(fVar59 + auVar45._0_4_));
  auVar45 = vroundss_avx(auVar45,auVar45,0xb);
  iVar43 = (int)auVar45._0_4_;
  fVar58 = -0.08 / (fVar59 * fVar59);
  auVar46 = vpternlogd_avx512vl(auVar53,ZEXT416((uint)ipoint->x),auVar52,0xf8);
  auVar46 = ZEXT416((uint)(ipoint->x + auVar46._0_4_));
  auVar46 = vroundss_avx(auVar46,auVar46,0xb);
  auVar47._0_8_ = (double)auVar46._0_4_;
  auVar47._8_8_ = auVar46._8_8_;
  auVar51._0_8_ = (double)fVar59;
  auVar51._8_8_ = 0;
  auVar46 = vfmadd231sd_fma(auVar47,auVar51,ZEXT816(0x3fe0000000000000));
  auVar50._0_4_ = (float)auVar46._0_8_;
  auVar50._4_12_ = auVar46._4_12_;
  auVar46 = vpternlogd_avx512vl(auVar53,ZEXT416((uint)ipoint->y),auVar52,0xf8);
  auVar46 = ZEXT416((uint)(ipoint->y + auVar46._0_4_));
  auVar46 = vroundss_avx(auVar46,auVar46,0xb);
  auVar48._0_8_ = (double)auVar46._0_4_;
  auVar48._8_8_ = auVar46._8_8_;
  auVar46 = vfmadd231sd_fma(auVar48,auVar51,ZEXT816(0x3fe0000000000000));
  auVar49._0_4_ = (float)auVar46._0_8_;
  auVar49._4_12_ = auVar46._4_12_;
  auVar46._0_4_ = (int)auVar45._0_4_;
  auVar46._4_4_ = (int)auVar45._4_4_;
  auVar46._8_4_ = (int)auVar45._8_4_;
  auVar46._12_4_ = (int)auVar45._12_4_;
  auVar45 = vcvtdq2ps_avx(auVar46);
  fVar3 = auVar50._0_4_ - auVar45._0_4_;
  fVar4 = auVar49._0_4_ - auVar45._0_4_;
  auVar45 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar59),auVar50);
  auVar46 = vpternlogd_avx512vl(auVar53,auVar45,auVar52,0xf8);
  auVar45 = ZEXT416((uint)(auVar45._0_4_ + auVar46._0_4_));
  auVar45 = vroundss_avx(auVar45,auVar45,0xb);
  auVar46 = ZEXT416((uint)fVar59);
  if (iVar43 < (int)auVar45._0_4_) {
    auVar45 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar46,auVar49);
    auVar54._8_4_ = 0x3effffff;
    auVar54._0_8_ = 0x3effffff3effffff;
    auVar54._12_4_ = 0x3effffff;
    auVar55._8_4_ = 0x80000000;
    auVar55._0_8_ = 0x8000000080000000;
    auVar55._12_4_ = 0x80000000;
    auVar47 = vpternlogd_avx512vl(auVar55,auVar45,auVar54,0xea);
    auVar45 = ZEXT416((uint)(auVar45._0_4_ + auVar47._0_4_));
    auVar45 = vroundss_avx(auVar45,auVar45,0xb);
    if (iVar43 < (int)auVar45._0_4_) {
      auVar45 = vfmadd231ss_fma(auVar50,auVar46,ZEXT416(0x41300000));
      auVar56._8_4_ = 0x80000000;
      auVar56._0_8_ = 0x8000000080000000;
      auVar56._12_4_ = 0x80000000;
      auVar47 = vpternlogd_avx512vl(auVar56,auVar45,auVar54,0xea);
      auVar45 = ZEXT416((uint)(auVar45._0_4_ + auVar47._0_4_));
      auVar45 = vroundss_avx(auVar45,auVar45,0xb);
      if ((int)auVar45._0_4_ + iVar43 <= iimage->width) {
        auVar45 = vfmadd231ss_fma(auVar49,auVar46,ZEXT416(0x41300000));
        auVar16._8_4_ = 0x80000000;
        auVar16._0_8_ = 0x8000000080000000;
        auVar16._12_4_ = 0x80000000;
        auVar47 = vpternlogd_avx512vl(auVar54,auVar45,auVar16,0xf8);
        auVar45 = ZEXT416((uint)(auVar45._0_4_ + auVar47._0_4_));
        auVar45 = vroundss_avx(auVar45,auVar45,0xb);
        if ((int)auVar45._0_4_ + iVar43 <= iimage->height) {
          pfVar34 = iimage->data;
          iVar2 = iimage->data_width;
          iVar18 = -0xc;
          lVar22 = 0;
          pfVar20 = haarResponseX;
          pfVar38 = haarResponseY;
          do {
            auVar45._0_4_ = (float)iVar18;
            auVar45._4_12_ = in_ZMM8._4_12_;
            auVar45 = vfmadd213ss_fma(auVar45,auVar46,ZEXT416((uint)(fVar4 + 0.5)));
            iVar39 = (int)auVar45._0_4_;
            iVar23 = (iVar39 + -1) * iVar2;
            iVar21 = (iVar39 + -1 + iVar43) * iVar2;
            iVar39 = (iVar39 + -1 + iVar43 * 2) * iVar2;
            lVar26 = 0;
            do {
              auVar66._0_4_ = (float)((int)lVar26 + -0xc);
              auVar66._4_12_ = in_ZMM8._4_12_;
              auVar45 = vfmadd213ss_fma(auVar66,auVar46,ZEXT416((uint)(fVar3 + 0.5)));
              iVar35 = (int)auVar45._0_4_;
              iVar1 = iVar35 + -1 + iVar43;
              iVar30 = iVar35 + -1 + iVar43 * 2;
              fVar59 = pfVar34[iVar21 + -1 + iVar35];
              fVar5 = pfVar34[iVar39 + -1 + iVar35];
              fVar6 = pfVar34[iVar30 + iVar39];
              fVar7 = pfVar34[iVar23 + -1 + iVar35];
              fVar8 = pfVar34[iVar23 + iVar30];
              auVar45 = vfmadd213ss_fma(ZEXT416((uint)(pfVar34[iVar23 + iVar1] -
                                                      pfVar34[iVar1 + iVar39])),
                                        SUB6416(ZEXT464(0x40000000),0),
                                        ZEXT416((uint)(fVar6 - fVar7)));
              fVar63 = pfVar34[iVar21 + iVar30];
              pfVar20[lVar26] = (fVar5 - fVar8) + auVar45._0_4_;
              auVar45 = vfmadd213ss_fma(ZEXT416((uint)(fVar59 - fVar63)),
                                        SUB6416(ZEXT464(0x40000000),0),
                                        ZEXT416((uint)(fVar6 - fVar7)));
              pfVar38[lVar26] = auVar45._0_4_ - (fVar5 - fVar8);
              lVar26 = lVar26 + 1;
            } while (lVar26 != 0x18);
            iVar18 = iVar18 + 1;
            lVar22 = lVar22 + 1;
            pfVar38 = pfVar38 + 0x18;
            pfVar20 = pfVar20 + 0x18;
          } while (lVar22 != 0x18);
          goto LAB_0019d92a;
        }
      }
    }
  }
  iVar2 = iVar43 * 2;
  iVar18 = -0xc;
  lVar26 = 0;
  lVar22 = 0;
  do {
    auVar60._0_4_ = (float)iVar18;
    auVar60._4_12_ = in_ZMM8._4_12_;
    auVar45 = vfmadd213ss_fma(auVar60,auVar71._0_16_,ZEXT416((uint)fVar4));
    fVar59 = auVar45._0_4_;
    iVar39 = (int)((double)((ulong)(0.0 <= fVar59) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar59) * -0x4020000000000000) + (double)fVar59);
    lVar41 = 0;
    lVar25 = lVar26;
    do {
      auVar61._0_4_ = (float)((int)lVar41 + -0xc);
      auVar61._4_12_ = in_ZMM8._4_12_;
      auVar45 = vfmadd213ss_fma(auVar61,auVar71._0_16_,ZEXT416((uint)fVar3));
      fVar59 = auVar45._0_4_;
      pfVar34 = (float *)((long)haarResponseY + lVar25);
      iVar23 = (int)((double)((ulong)(0.0 <= fVar59) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar59) * -0x4020000000000000) + (double)fVar59);
      if ((((iVar39 < 1) || (iVar23 < 1)) || (iimage->height < iVar2 + iVar39)) ||
         (iVar21 = iVar2 + iVar23, iimage->width < iVar21)) {
        haarXY(iimage,iVar39,iVar23,iVar43,(float *)((long)haarResponseX + lVar25),pfVar34);
        auVar71 = ZEXT1664(auVar46);
      }
      else {
        iVar1 = iVar23 + -1 + iVar43;
        pfVar20 = iimage->data;
        iVar30 = iimage->data_width;
        iVar35 = iVar30 * (iVar39 + -1);
        iVar37 = iVar30 * (iVar39 + -1 + iVar43);
        fVar59 = pfVar20[iVar37 + -1 + iVar23];
        iVar30 = iVar30 * (iVar2 + -1 + iVar39);
        fVar5 = pfVar20[iVar30 + -1 + iVar23];
        fVar6 = pfVar20[iVar30 + -1 + iVar21];
        fVar7 = pfVar20[iVar35 + -1 + iVar23];
        fVar8 = pfVar20[iVar35 + -1 + iVar21];
        fVar63 = pfVar20[iVar37 + -1 + iVar21];
        auVar45 = vfmadd213ss_fma(ZEXT416((uint)(pfVar20[iVar35 + iVar1] - pfVar20[iVar30 + iVar1]))
                                  ,SUB6416(ZEXT464(0x40000000),0),ZEXT416((uint)(fVar6 - fVar7)));
        *(float *)((long)haarResponseX + lVar25) = (fVar5 - fVar8) + auVar45._0_4_;
        auVar45 = vfmadd213ss_fma(ZEXT416((uint)(fVar59 - fVar63)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar6 - fVar7)));
        *pfVar34 = auVar45._0_4_ - (fVar5 - fVar8);
      }
      lVar41 = lVar41 + 1;
      lVar25 = lVar25 + 4;
    } while (lVar41 != 0x18);
    iVar18 = iVar18 + 1;
    lVar22 = lVar22 + 1;
    lVar26 = lVar26 + 0x60;
  } while (lVar22 != 0x18);
LAB_0019d92a:
  fVar59 = auVar71._0_4_;
  auVar70._8_4_ = 0x3effffff;
  auVar70._0_8_ = 0x3effffff3effffff;
  auVar70._12_4_ = 0x3effffff;
  auVar69._8_4_ = 0x80000000;
  auVar69._0_8_ = 0x8000000080000000;
  auVar69._12_4_ = 0x80000000;
  auVar45 = vpternlogd_avx512vl(auVar70,ZEXT416((uint)(fVar59 * 0.5)),auVar69,0xf8);
  auVar45 = ZEXT416((uint)(fVar59 * 0.5 + auVar45._0_4_));
  auVar45 = vroundss_avx(auVar45,auVar45,0xb);
  auVar46 = vpternlogd_avx512vl(auVar70,ZEXT416((uint)(fVar59 * 1.5)),auVar69,0xf8);
  auVar46 = ZEXT416((uint)(fVar59 * 1.5 + auVar46._0_4_));
  auVar46 = vroundss_avx(auVar46,auVar46,0xb);
  auVar47 = vpternlogd_avx512vl(auVar70,ZEXT416((uint)(fVar59 * 2.5)),auVar69,0xf8);
  auVar47 = ZEXT416((uint)(fVar59 * 2.5 + auVar47._0_4_));
  auVar47 = vroundss_avx(auVar47,auVar47,0xb);
  auVar48 = vpternlogd_avx512vl(auVar70,ZEXT416((uint)(fVar59 * 3.5)),auVar69,0xf8);
  auVar48 = ZEXT416((uint)(fVar59 * 3.5 + auVar48._0_4_));
  auVar48 = vroundss_avx(auVar48,auVar48,0xb);
  auVar49 = vpternlogd_avx512vl(auVar70,ZEXT416((uint)(fVar59 * 4.5)),auVar69,0xf8);
  auVar49 = ZEXT416((uint)(fVar59 * 4.5 + auVar49._0_4_));
  auVar49 = vroundss_avx(auVar49,auVar49,0xb);
  auVar50 = vpternlogd_avx512vl(auVar70,ZEXT416((uint)(fVar59 * 5.5)),auVar69,0xf8);
  auVar50 = ZEXT416((uint)(fVar59 * 5.5 + auVar50._0_4_));
  auVar50 = vroundss_avx(auVar50,auVar50,0xb);
  auVar51 = vpternlogd_avx512vl(auVar70,ZEXT416((uint)(fVar59 * 6.5)),auVar69,0xf8);
  auVar51 = ZEXT416((uint)(fVar59 * 6.5 + auVar51._0_4_));
  auVar51 = vroundss_avx(auVar51,auVar51,0xb);
  auVar52 = vpternlogd_avx512vl(auVar70,ZEXT416((uint)(fVar59 * 7.5)),auVar69,0xf8);
  auVar52 = ZEXT416((uint)(auVar52._0_4_ + fVar59 * 7.5));
  auVar52 = vroundss_avx(auVar52,auVar52,0xb);
  auVar53 = vpternlogd_avx512vl(auVar70,ZEXT416((uint)(fVar59 * 8.5)),auVar69,0xf8);
  auVar53 = ZEXT416((uint)(fVar59 * 8.5 + auVar53._0_4_));
  auVar53 = vroundss_avx(auVar53,auVar53,0xb);
  auVar54 = vpternlogd_avx512vl(auVar70,ZEXT416((uint)(fVar59 * 9.5)),auVar69,0xf8);
  auVar54 = ZEXT416((uint)(fVar59 * 9.5 + auVar54._0_4_));
  auVar54 = vroundss_avx(auVar54,auVar54,0xb);
  auVar55 = vpternlogd_avx512vl(auVar70,ZEXT416((uint)(fVar59 * 10.5)),auVar69,0xf8);
  auVar55 = ZEXT416((uint)(fVar59 * 10.5 + auVar55._0_4_));
  auVar55 = vroundss_avx(auVar55,auVar55,0xb);
  auVar56 = vpternlogd_avx512vl(auVar70,ZEXT416((uint)(fVar59 * 11.5)),auVar69,0xf8);
  auVar56 = ZEXT416((uint)(fVar59 * 11.5 + auVar56._0_4_));
  auVar56 = vroundss_avx(auVar56,auVar56,0xb);
  fVar63 = auVar47._0_4_;
  fVar59 = fVar63 + auVar46._0_4_;
  fVar3 = fVar63 + auVar45._0_4_;
  fVar4 = fVar63 - auVar45._0_4_;
  fVar5 = fVar63 - auVar46._0_4_;
  fVar6 = fVar63 - auVar48._0_4_;
  fVar7 = fVar63 - auVar49._0_4_;
  fVar8 = fVar63 - auVar50._0_4_;
  fVar63 = fVar63 - auVar51._0_4_;
  fVar68 = auVar52._0_4_;
  fVar9 = fVar68 - auVar48._0_4_;
  fVar10 = fVar68 - auVar49._0_4_;
  fVar11 = fVar68 - auVar50._0_4_;
  fVar12 = fVar68 - auVar51._0_4_;
  fVar13 = fVar68 - auVar53._0_4_;
  fVar14 = fVar68 - auVar54._0_4_;
  fVar15 = fVar68 - auVar55._0_4_;
  fVar68 = fVar68 - auVar56._0_4_;
  gauss_s1_c0[0] = expf(fVar59 * fVar59 * fVar58);
  gauss_s1_c0[1] = expf(fVar3 * fVar3 * fVar58);
  gauss_s1_c0[2] = expf(fVar4 * fVar4 * fVar58);
  gauss_s1_c0[3] = expf(fVar5 * fVar5 * fVar58);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar6 * fVar6 * fVar58);
  gauss_s1_c0[6] = expf(fVar7 * fVar7 * fVar58);
  gauss_s1_c0[7] = expf(fVar8 * fVar8 * fVar58);
  gauss_s1_c0[8] = expf(fVar63 * fVar63 * fVar58);
  gauss_s1_c1[0] = expf(fVar9 * fVar9 * fVar58);
  gauss_s1_c1[1] = expf(fVar10 * fVar10 * fVar58);
  gauss_s1_c1[2] = expf(fVar11 * fVar11 * fVar58);
  gauss_s1_c1[3] = expf(fVar12 * fVar12 * fVar58);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar13 * fVar13 * fVar58);
  gauss_s1_c1[6] = expf(fVar14 * fVar14 * fVar58);
  gauss_s1_c1[7] = expf(fVar15 * fVar15 * fVar58);
  gauss_s1_c1[8] = expf(fVar68 * fVar68 * fVar58);
  uVar33 = 0xfffffff8;
  lVar22 = 0;
  fVar59 = 0.0;
  auVar62._8_4_ = 0x7fffffff;
  auVar62._0_8_ = 0x7fffffff7fffffff;
  auVar62._12_4_ = 0x7fffffff;
  lVar26 = 0;
  pfVar34 = haarResponseX;
  pfVar20 = haarResponseY;
  do {
    uVar31 = (uint)uVar33;
    pfVar38 = gauss_s1_c0;
    if (uVar31 == 7) {
      pfVar38 = gauss_s1_c1;
    }
    if (uVar31 == 0xfffffff8) {
      pfVar38 = gauss_s1_c1;
    }
    lVar22 = (long)(int)lVar22;
    iVar43 = (int)lVar26;
    lVar26 = (long)iVar43;
    uVar28 = 0;
    uVar32 = 0xfffffff8;
    pfVar29 = pfVar34;
    pfVar36 = pfVar20;
    do {
      pfVar27 = gauss_s1_c0;
      if (uVar32 == 7) {
        pfVar27 = gauss_s1_c1;
      }
      if (uVar32 == 0xfffffff8) {
        pfVar27 = gauss_s1_c1;
      }
      uVar24 = (ulong)(uVar32 >> 0x1c & 0xfffffff8);
      auVar71 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar19 = uVar28;
      pfVar40 = pfVar36;
      pfVar42 = pfVar29;
      do {
        lVar25 = 0;
        pfVar44 = (float *)((long)pfVar38 + (ulong)(uint)((int)(uVar33 >> 0x1f) << 5));
        do {
          fVar3 = pfVar27[uVar24] * *pfVar44;
          auVar45 = vinsertps_avx(ZEXT416((uint)pfVar40[lVar25]),ZEXT416((uint)pfVar42[lVar25]),0x10
                                 );
          auVar67._0_4_ = fVar3 * auVar45._0_4_;
          auVar67._4_4_ = fVar3 * auVar45._4_4_;
          auVar67._8_4_ = fVar3 * auVar45._8_4_;
          auVar67._12_4_ = fVar3 * auVar45._12_4_;
          auVar45 = vandps_avx(auVar67,auVar62);
          auVar45 = vmovlhps_avx(auVar67,auVar45);
          auVar64._0_4_ = auVar71._0_4_ + auVar45._0_4_;
          auVar64._4_4_ = auVar71._4_4_ + auVar45._4_4_;
          auVar64._8_4_ = auVar71._8_4_ + auVar45._8_4_;
          auVar64._12_4_ = auVar71._12_4_ + auVar45._12_4_;
          auVar71 = ZEXT1664(auVar64);
          pfVar44 = pfVar44 + (ulong)(~uVar31 >> 0x1f) * 2 + -1;
          lVar25 = lVar25 + 1;
        } while (lVar25 != 9);
        uVar19 = uVar19 + 0x18;
        uVar24 = uVar24 + (ulong)(-1 < (int)uVar32) * 2 + -1;
        pfVar42 = pfVar42 + 0x18;
        pfVar40 = pfVar40 + 0x18;
      } while (uVar19 < uVar32 * 0x18 + 0x198);
      fVar3 = gauss_s2_arr[lVar26];
      auVar17._4_4_ = fVar3;
      auVar17._0_4_ = fVar3;
      auVar17._8_4_ = fVar3;
      auVar17._12_4_ = fVar3;
      auVar47 = vmulps_avx512vl(auVar64,auVar17);
      lVar26 = lVar26 + 1;
      *(undefined1 (*) [16])(ipoint->descriptor + lVar22) = auVar47;
      auVar65._0_4_ = auVar47._0_4_ * auVar47._0_4_;
      auVar65._4_4_ = auVar47._4_4_ * auVar47._4_4_;
      auVar65._8_4_ = auVar47._8_4_ * auVar47._8_4_;
      auVar65._12_4_ = auVar47._12_4_ * auVar47._12_4_;
      auVar45 = vmovshdup_avx(auVar65);
      auVar46 = vfmadd231ss_fma(auVar45,auVar47,auVar47);
      auVar45 = vshufpd_avx(auVar47,auVar47,1);
      auVar46 = vfmadd213ss_fma(auVar45,auVar45,auVar46);
      auVar45 = vshufps_avx(auVar47,auVar47,0xff);
      auVar45 = vfmadd213ss_fma(auVar45,auVar45,auVar46);
      fVar59 = fVar59 + auVar45._0_4_;
      lVar22 = lVar22 + 4;
      uVar32 = uVar32 + 5;
      uVar28 = uVar28 + 0x78;
      pfVar29 = pfVar29 + 0x78;
      pfVar36 = pfVar36 + 0x78;
    } while (iVar43 + 4 != (int)lVar26);
    pfVar34 = pfVar34 + 5;
    pfVar20 = pfVar20 + 5;
    uVar33 = (ulong)(uVar31 + 5);
  } while ((int)uVar31 < 3);
  if (fVar59 < 0.0) {
    fVar59 = sqrtf(fVar59);
  }
  else {
    auVar45 = vsqrtss_avx(ZEXT416((uint)fVar59),ZEXT416((uint)fVar59));
    fVar59 = auVar45._0_4_;
  }
  auVar71 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar59)));
  lVar22 = 0;
  do {
    auVar57 = vmulps_avx512f(auVar71,*(undefined1 (*) [64])(ipoint->descriptor + lVar22));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar22) = auVar57;
    lVar22 = lVar22 + 0x10;
  } while (lVar22 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_rounding(struct integral_image* iimage, struct interest_point* ipoint) {
    /*
    applied optimizations:
        - all of get_msurf_descriptors_pecompute_haar
        - simplify rounding as (int) (x+0.5) if x>=0 and (int) (x-0.5) oterwise where return of roundf is int
    */

    float scale = ipoint->scale;
    // float scale_mul_25f = 2.5f*scale;
    int int_scale = (int) roundf(scale);
    // int int_scale_mul_2 =  2 * int_scale;
    float scale_squared = scale*scale;

    float g1_factor = -0.08f / (scale_squared); // since 0.08f / (scale*scale) == 1.0f / (2.0f * 2.5f * scale * 2.5f * scale)
    //float g2_factor = -1.0f / 4.5f; // since 1.0f / 4.5f == 1.0f / (2.0f * 1.5f * 1.5f)

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;

    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    //r(2.5*s) + r(1.5*s) == -(r(2.5*s) - r(6.5*s))

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    { // some outside

        for (int l=-12, l_count=0; l<12; ++l, ++l_count) {
            // int sample_y = (int) roundf(ipoint_y + l * scale);
            float ipoint_y_sub_int_scale_add_l_mul_scale = ipoint_y_sub_int_scale + l * scale;
            int sample_y_sub_int_scale = (int) (ipoint_y_sub_int_scale_add_l_mul_scale + (ipoint_y_sub_int_scale_add_l_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; ++k, k_count++) {

                //Get x coords of sample point
                // int sample_x = (int) roundf(ipoint_x + k * scale);
                float ipoint_x_sub_int_scale_add_k_mul_scale = ipoint_x_sub_int_scale + k * scale;
                int sample_x_sub_int_scale = (int) (ipoint_x_sub_int_scale_add_k_mul_scale + (ipoint_x_sub_int_scale_add_k_mul_scale>=0 ? 0.5 : -0.5));

                // float rx = 0.0f;
                // float ry = 0.0f;
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale, sample_x_sub_int_scale, int_scale, &haarResponseX[l_count*24+k_count], &haarResponseY[l_count*24+k_count]);

                // haarResponseX[(l+12)*24+(k+12)] = rx;
                // haarResponseY[(l+12)*24+(k+12)] = ry;
            }

        }

    } else {

        for (int l=-12, l_count=0; l<12; ++l, ++l_count) {
            // int sample_y = (int) roundf(ipoint_y + l * scale);
            int sample_y_sub_int_scale = (int)(ipoint_y_sub_int_scale_add_05 + l * scale);

            for (int k=-12, k_count=0; k<12; ++k, ++k_count) {

                //Get x coords of sample point
                // int sample_x = (int) roundf(ipoint_x + k * scale);
                int sample_x_sub_int_scale = (int)(ipoint_x_sub_int_scale_add_05 + k * scale);

                // float rx = 0.0f;
                // float ry = 0.0f;
                haarXY_unconditional(iimage, sample_y_sub_int_scale, sample_x_sub_int_scale, int_scale, &haarResponseX[l_count*24+k_count], &haarResponseY[l_count*24+k_count]);

                // haarResponseX[(l+12)*24+(k+12)] = rx;
                // haarResponseY[(l+12)*24+(k+12)] = ry;
            }

        }
        
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}